

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTDMT_compressStream_generic
                 (ZSTDMT_CCtx *mtctx,ZSTD_outBuffer *output,ZSTD_inBuffer *input,
                 ZSTD_EndDirective endOp)

{
  size_t sVar1;
  void *pvVar2;
  void *pvVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  ZSTD_CDict *cdict;
  ZSTD_CCtx_params params;
  uint uVar7;
  int iVar8;
  size_t sVar9;
  size_t __n;
  size_t sVar10;
  bool bVar11;
  syncPoint_t sVar12;
  ZSTDMT_CCtx *local_148;
  size_t remainingToFlush;
  size_t err_code;
  size_t jobSize;
  syncPoint_t syncPoint;
  undefined8 uStack_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  void *pvStack_40;
  size_t cSize;
  uint forwardInputProgress;
  ZSTD_EndDirective endOp_local;
  ZSTD_inBuffer *input_local;
  ZSTD_outBuffer *output_local;
  ZSTDMT_CCtx *mtctx_local;
  
  bVar11 = false;
  if (output->size < output->pos) {
    __assert_fail("output->pos <= output->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x5234,
                  "size_t ZSTDMT_compressStream_generic(ZSTDMT_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                 );
  }
  if (input->size < input->pos) {
    __assert_fail("input->pos <= input->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x5235,
                  "size_t ZSTDMT_compressStream_generic(ZSTDMT_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                 );
  }
  if (mtctx->singleBlockingThread == 0) {
    if ((mtctx->frameEnded == 0) || (endOp != ZSTD_e_continue)) {
      if (((mtctx->params).rsyncable == 0) &&
         ((((mtctx->nextJobID == 0 && ((mtctx->inBuff).filled == 0)) && (mtctx->jobReady == 0)) &&
          ((endOp == ZSTD_e_end &&
           (sVar10 = output->size, sVar1 = output->pos,
           sVar9 = ZSTD_compressBound(input->size - input->pos), sVar9 <= sVar10 - sVar1)))))) {
        pvVar2 = output->dst;
        sVar10 = output->pos;
        sVar1 = output->size;
        sVar9 = output->pos;
        pvVar3 = input->src;
        sVar4 = input->pos;
        sVar5 = input->size;
        sVar6 = input->pos;
        cdict = mtctx->cdict;
        memcpy(&syncPoint.flush,&mtctx->params,0x90);
        params.cParams._4_8_ = uStack_c0;
        params.format = syncPoint.flush;
        params.cParams.windowLog = syncPoint._12_4_;
        params.cParams._12_8_ = uStack_b8;
        params.cParams._20_8_ = uStack_b0;
        params.fParams._0_8_ = local_a8;
        params._40_8_ = uStack_a0;
        params._48_8_ = uStack_98;
        params.targetCBlockSize = uStack_90;
        params._64_8_ = local_88;
        params._72_8_ = uStack_80;
        params.jobSize = uStack_78;
        params._88_8_ = uStack_70;
        params.ldmParams._0_8_ = uStack_68;
        params.ldmParams._8_8_ = uStack_60;
        params.ldmParams._16_8_ = local_58;
        params.customMem.customAlloc = (ZSTD_allocFunction)uStack_50;
        params.customMem.customFree = (ZSTD_freeFunction)uStack_48;
        params.customMem.opaque = pvStack_40;
        mtctx_local = (ZSTDMT_CCtx *)
                      ZSTDMT_compress_advanced_internal
                                (mtctx,(void *)((long)pvVar2 + sVar10),sVar1 - sVar9,
                                 (void *)((long)pvVar3 + sVar4),sVar5 - sVar6,cdict,params);
        uVar7 = ZSTD_isError((size_t)mtctx_local);
        if (uVar7 == 0) {
          input->pos = input->size;
          output->pos = (long)&mtctx_local->factory + output->pos;
          mtctx->allJobsCompleted = 1;
          mtctx->frameEnded = 1;
          mtctx_local = (ZSTDMT_CCtx *)0x0;
        }
      }
      else {
        cSize._4_4_ = endOp;
        if ((mtctx->jobReady == 0) && (input->pos < input->size)) {
          if ((mtctx->inBuff).buffer.start == (void *)0x0) {
            if ((mtctx->inBuff).filled != 0) {
              __assert_fail("mtctx->inBuff.filled == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x5257,
                            "size_t ZSTDMT_compressStream_generic(ZSTDMT_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                           );
            }
            iVar8 = ZSTDMT_tryGetInputRange(mtctx);
            if ((iVar8 == 0) && (mtctx->doneJobID == mtctx->nextJobID)) {
              __assert_fail("mtctx->doneJobID != mtctx->nextJobID",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x525d,
                            "size_t ZSTDMT_compressStream_generic(ZSTDMT_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                           );
            }
          }
          if ((mtctx->inBuff).buffer.start != (void *)0x0) {
            sVar12 = findSynchronizationPoint(mtctx,*input);
            __n = sVar12.toLoad;
            syncPoint.toLoad._0_4_ = sVar12.flush;
            if (((int)syncPoint.toLoad != 0) && (endOp == ZSTD_e_continue)) {
              cSize._4_4_ = ZSTD_e_flush;
            }
            if ((mtctx->inBuff).buffer.capacity < mtctx->targetSectionSize) {
              __assert_fail("mtctx->inBuff.buffer.capacity >= mtctx->targetSectionSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x5266,
                            "size_t ZSTDMT_compressStream_generic(ZSTDMT_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                           );
            }
            memcpy((void *)((long)(mtctx->inBuff).buffer.start + (mtctx->inBuff).filled),
                   (void *)((long)input->src + input->pos),__n);
            input->pos = __n + input->pos;
            (mtctx->inBuff).filled = __n + (mtctx->inBuff).filled;
            bVar11 = __n != 0;
          }
          if ((input->pos < input->size) && (cSize._4_4_ == ZSTD_e_end)) {
            cSize._4_4_ = ZSTD_e_flush;
          }
        }
        if ((((mtctx->jobReady != 0) || (mtctx->targetSectionSize <= (mtctx->inBuff).filled)) ||
            ((cSize._4_4_ != ZSTD_e_continue && ((mtctx->inBuff).filled != 0)))) ||
           ((cSize._4_4_ == ZSTD_e_end && (mtctx->frameEnded == 0)))) {
          if (mtctx->targetSectionSize < (mtctx->inBuff).filled) {
            __assert_fail("mtctx->inBuff.filled <= mtctx->targetSectionSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x5277,
                          "size_t ZSTDMT_compressStream_generic(ZSTDMT_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                         );
          }
          sVar10 = ZSTDMT_createCompressionJob(mtctx,(mtctx->inBuff).filled,cSize._4_4_);
          uVar7 = ERR_isError(sVar10);
          if (uVar7 != 0) {
            return sVar10;
          }
        }
        local_148 = (ZSTDMT_CCtx *)
                    ZSTDMT_flushProduced(mtctx,output,(uint)((bVar11 ^ 0xffU) & 1),cSize._4_4_);
        mtctx_local = local_148;
        if (input->pos < input->size) {
          if (local_148 < (ZSTDMT_CCtx *)0x2) {
            local_148 = (ZSTDMT_CCtx *)0x1;
          }
          mtctx_local = local_148;
        }
      }
    }
    else {
      mtctx_local = (ZSTDMT_CCtx *)0xffffffffffffffc4;
    }
  }
  else {
    mtctx_local = (ZSTDMT_CCtx *)ZSTD_compressStream2(mtctx->cctxPool->cctx[0],output,input,endOp);
  }
  return (size_t)mtctx_local;
}

Assistant:

size_t ZSTDMT_compressStream_generic(ZSTDMT_CCtx* mtctx,
                                     ZSTD_outBuffer* output,
                                     ZSTD_inBuffer* input,
                                     ZSTD_EndDirective endOp)
{
    unsigned forwardInputProgress = 0;
    DEBUGLOG(5, "ZSTDMT_compressStream_generic (endOp=%u, srcSize=%u)",
                (U32)endOp, (U32)(input->size - input->pos));
    assert(output->pos <= output->size);
    assert(input->pos  <= input->size);

    if (mtctx->singleBlockingThread) {  /* delegate to single-thread (synchronous) */
        return ZSTD_compressStream2(mtctx->cctxPool->cctx[0], output, input, endOp);
    }

    if ((mtctx->frameEnded) && (endOp==ZSTD_e_continue)) {
        /* current frame being ended. Only flush/end are allowed */
        return ERROR(stage_wrong);
    }

    /* single-pass shortcut (note : synchronous-mode) */
    if ( (!mtctx->params.rsyncable)   /* rsyncable mode is disabled */
      && (mtctx->nextJobID == 0)      /* just started */
      && (mtctx->inBuff.filled == 0)  /* nothing buffered */
      && (!mtctx->jobReady)           /* no job already created */
      && (endOp == ZSTD_e_end)        /* end order */
      && (output->size - output->pos >= ZSTD_compressBound(input->size - input->pos)) ) { /* enough space in dst */
        size_t const cSize = ZSTDMT_compress_advanced_internal(mtctx,
                (char*)output->dst + output->pos, output->size - output->pos,
                (const char*)input->src + input->pos, input->size - input->pos,
                mtctx->cdict, mtctx->params);
        if (ZSTD_isError(cSize)) return cSize;
        input->pos = input->size;
        output->pos += cSize;
        mtctx->allJobsCompleted = 1;
        mtctx->frameEnded = 1;
        return 0;
    }

    /* fill input buffer */
    if ( (!mtctx->jobReady)
      && (input->size > input->pos) ) {   /* support NULL input */
        if (mtctx->inBuff.buffer.start == NULL) {
            assert(mtctx->inBuff.filled == 0); /* Can't fill an empty buffer */
            if (!ZSTDMT_tryGetInputRange(mtctx)) {
                /* It is only possible for this operation to fail if there are
                 * still compression jobs ongoing.
                 */
                DEBUGLOG(5, "ZSTDMT_tryGetInputRange failed");
                assert(mtctx->doneJobID != mtctx->nextJobID);
            } else
                DEBUGLOG(5, "ZSTDMT_tryGetInputRange completed successfully : mtctx->inBuff.buffer.start = %p", mtctx->inBuff.buffer.start);
        }
        if (mtctx->inBuff.buffer.start != NULL) {
            syncPoint_t const syncPoint = findSynchronizationPoint(mtctx, *input);
            if (syncPoint.flush && endOp == ZSTD_e_continue) {
                endOp = ZSTD_e_flush;
            }
            assert(mtctx->inBuff.buffer.capacity >= mtctx->targetSectionSize);
            DEBUGLOG(5, "ZSTDMT_compressStream_generic: adding %u bytes on top of %u to buffer of size %u",
                        (U32)syncPoint.toLoad, (U32)mtctx->inBuff.filled, (U32)mtctx->targetSectionSize);
            memcpy((char*)mtctx->inBuff.buffer.start + mtctx->inBuff.filled, (const char*)input->src + input->pos, syncPoint.toLoad);
            input->pos += syncPoint.toLoad;
            mtctx->inBuff.filled += syncPoint.toLoad;
            forwardInputProgress = syncPoint.toLoad>0;
        }
        if ((input->pos < input->size) && (endOp == ZSTD_e_end))
            endOp = ZSTD_e_flush;   /* can't end now : not all input consumed */
    }

    if ( (mtctx->jobReady)
      || (mtctx->inBuff.filled >= mtctx->targetSectionSize)  /* filled enough : let's compress */
      || ((endOp != ZSTD_e_continue) && (mtctx->inBuff.filled > 0))  /* something to flush : let's go */
      || ((endOp == ZSTD_e_end) && (!mtctx->frameEnded)) ) {   /* must finish the frame with a zero-size block */
        size_t const jobSize = mtctx->inBuff.filled;
        assert(mtctx->inBuff.filled <= mtctx->targetSectionSize);
        FORWARD_IF_ERROR( ZSTDMT_createCompressionJob(mtctx, jobSize, endOp) );
    }

    /* check for potential compressed data ready to be flushed */
    {   size_t const remainingToFlush = ZSTDMT_flushProduced(mtctx, output, !forwardInputProgress, endOp); /* block if there was no forward input progress */
        if (input->pos < input->size) return MAX(remainingToFlush, 1);  /* input not consumed : do not end flush yet */
        DEBUGLOG(5, "end of ZSTDMT_compressStream_generic: remainingToFlush = %u", (U32)remainingToFlush);
        return remainingToFlush;
    }
}